

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  byte bVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiTableSettings *p;
  int iVar5;
  long lVar6;
  int iVar7;
  ImGuiTableColumn *pIVar8;
  long lVar9;
  byte *pbVar10;
  char *pcVar11;
  
  pIVar3 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x20) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      iVar7 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar3->SettingsTables,p);
      table->SettingsOffset = iVar7;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    if ('\0' < p->ColumnsCount) {
      pbVar10 = (byte *)((long)&p[1].RefScale + 3);
      iVar7 = 0;
      do {
        bVar1 = pbVar10[-3];
        iVar5 = (int)(char)bVar1;
        if ((-1 < iVar5) && (iVar5 < table->ColumnsCount)) {
          pIVar8 = (table->Columns).Data + iVar5;
          if ((table->Columns).DataEnd <= pIVar8) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                        ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
          }
          uVar2 = p->SaveFlags;
          if ((uVar2 & 1) != 0) {
            (&pIVar8->WidthStretchWeight)[(*pbVar10 & 8) == 0] = *(float *)(pbVar10 + -0xb);
            pIVar8->AutoFitQueue = '\0';
          }
          if ((uVar2 & 2) != 0) {
            bVar1 = pbVar10[-2];
          }
          pIVar8->DisplayOrder = bVar1;
          bVar4 = (bool)(*pbVar10 >> 2 & 1);
          pIVar8->IsVisibleNextFrame = bVar4;
          pIVar8->IsVisible = bVar4;
          pIVar8->SortOrder = pbVar10[-1];
          pIVar8->SortDirection = *pbVar10 & 3;
        }
        iVar7 = iVar7 + 1;
        pbVar10 = pbVar10 + 0xc;
      } while (iVar7 < p->ColumnsCount);
    }
    if (0 < table->ColumnsCount) {
      lVar6 = 0;
      lVar9 = 0;
      do {
        pIVar8 = (table->Columns).Data;
        if ((table->Columns).DataEnd <=
            (ImGuiTableColumn *)((long)&(pIVar8->ClipRect).Min.x + lVar6)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        pcVar11 = (table->DisplayOrderToIndex).Data + (&pIVar8->DisplayOrder)[lVar6];
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar11) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        *pcVar11 = (char)lVar9;
        lVar9 = lVar9 + 1;
        lVar6 = lVar6 + 0x68;
      } while (lVar9 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;
    //IM_ASSERT(settings->ColumnsCount == table->ColumnsCount);

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->WidthStretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImS8)column_n;
        column->IsVisible = column->IsVisibleNextFrame = column_settings->IsVisible;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // FIXME-TABLE: Need to validate .ini data
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImS8)column_n;
}